

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v10::detail::buffer<wchar_t>::append<wchar_t>
          (buffer<wchar_t> *this,wchar_t *begin,wchar_t *end)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (begin != end) {
    do {
      uVar4 = (long)end - (long)begin >> 2;
      if ((long)uVar4 < 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/core.h"
                    ,0x189,"negative value");
      }
      sVar1 = this->size_;
      uVar2 = this->capacity_;
      if (uVar2 < sVar1 + uVar4) {
        (**this->_vptr_buffer)(this);
        sVar1 = this->size_;
        uVar2 = this->capacity_;
      }
      uVar3 = uVar2 - sVar1;
      if (uVar4 <= uVar2 - sVar1) {
        uVar3 = uVar4;
      }
      if (uVar3 != 0) {
        memmove(this->ptr_ + sVar1,begin,uVar3 * 4);
        sVar1 = this->size_;
      }
      this->size_ = sVar1 + uVar3;
      begin = begin + uVar3;
    } while (begin != end);
  }
  return;
}

Assistant:

void buffer<T>::append(const U* begin, const U* end) {
  while (begin != end) {
    auto count = to_unsigned(end - begin);
    try_reserve(size_ + count);
    auto free_cap = capacity_ - size_;
    if (free_cap < count) count = free_cap;
    std::uninitialized_copy_n(begin, count, ptr_ + size_);
    size_ += count;
    begin += count;
  }
}